

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTests.cpp
# Opt level: O1

void __thiscall
ParserTest_FunctionCalls_Test::~ParserTest_FunctionCalls_Test(ParserTest_FunctionCalls_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ParserTest, FunctionCalls)
{
  const auto func = std::bind(&Parser::parseFunctionCall, std::placeholders::_1, std::optional<Token>{});
  std::list<std::shared_ptr<ExpressionNode>> arguments{};
  setupTest("f()", func, std::make_unique<FunctionCallNode>("f", std::move(arguments)));

  arguments = std::list<std::shared_ptr<ExpressionNode>>{};
  arguments.push_back(std::make_unique<VariableNode>("x"));
  setupTest("xyz(x)", func, std::make_unique<FunctionCallNode>("xyz", std::move(arguments)));

  arguments = std::list<std::shared_ptr<ExpressionNode>>{};
  arguments.push_back(std::make_shared<VariableNode>("x"));
  arguments.push_back(std::make_shared<NumericLiteralNode>(2));
  arguments.push_back(std::make_shared<VariableNode>("z"));
  setupTest("g(x, 2, z)", func, std::make_unique<FunctionCallNode>("g", std::move(arguments)));
}